

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitYieldStar(ParseNodeUni *yieldStarNode,ByteCodeGenerator *byteCodeGenerator,
                  FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  RegSlot resultReg;
  ParseNode *pnode;
  bool isAsync;
  ByteCodeLabel loopEntrance;
  ByteCodeLabel labelID;
  ByteCodeLabel labelID_00;
  ByteCodeLabel labelID_01;
  ByteCodeLabel labelID_02;
  RegSlot R0;
  RegSlot iteratorReg;
  RegSlot value;
  uint uVar1;
  RegSlot RVar2;
  uint uVar3;
  ByteCodeLabel resumeNormalLabel;
  ByteCodeLabel BVar4;
  RegSlot RVar5;
  ByteCodeLabel BVar6;
  
  isAsync = FuncInfo::IsAsyncGenerator(funcInfo);
  this = &byteCodeGenerator->m_writer;
  loopEntrance = Js::ByteCodeWriter::DefineLabel(this);
  labelID = Js::ByteCodeWriter::DefineLabel(this);
  labelID_00 = Js::ByteCodeWriter::DefineLabel(this);
  labelID_01 = Js::ByteCodeWriter::DefineLabel(this);
  labelID_02 = Js::ByteCodeWriter::DefineLabel(this);
  resultReg = (yieldStarNode->super_ParseNode).location;
  R0 = FuncInfo::AcquireTmpRegister(funcInfo);
  Js::ByteCodeWriter::Reg1(this,LdFalse,R0);
  iteratorReg = FuncInfo::AcquireTmpRegister(funcInfo);
  pnode = yieldStarNode->pnode1;
  Emit(pnode,byteCodeGenerator,funcInfo,0,false,false);
  if (isAsync) {
    EmitGetAsyncIterator(iteratorReg,pnode->location,byteCodeGenerator,funcInfo);
  }
  else {
    EmitGetIterator(iteratorReg,pnode->location,byteCodeGenerator,funcInfo);
  }
  FuncInfo::ReleaseLoc(funcInfo,pnode);
  value = FuncInfo::AcquireTmpRegister(funcInfo);
  uVar1 = FuncInfo::FindOrAddInlineCacheId(funcInfo,iteratorReg,0x107,true,false);
  Js::ByteCodeWriter::PatchableProperty(this,LdMethodFld,value,iteratorReg,uVar1,false,true);
  EmitFunctionCall(resultReg,value,iteratorReg,funcInfo->undefinedConstantRegister,byteCodeGenerator
                   ,funcInfo);
  uVar1 = Js::ByteCodeWriter::EnterLoop(this,loopEntrance);
  if (isAsync) {
    EmitAwait(resultReg,resultReg,byteCodeGenerator,funcInfo);
  }
  EmitThrowOnNotObject(resultReg,byteCodeGenerator);
  RVar2 = FuncInfo::AcquireTmpRegister(funcInfo);
  uVar3 = FuncInfo::FindOrAddInlineCacheId(funcInfo,resultReg,0x74,false,false);
  Js::ByteCodeWriter::PatchableProperty(this,LdFld,RVar2,resultReg,uVar3,false,false);
  Js::ByteCodeWriter::BrReg1(this,BrTrue_A,labelID_00,RVar2);
  FuncInfo::ReleaseTmpRegister(funcInfo,RVar2);
  Js::ByteCodeWriter::Reg1(this,LdFalse_ReuseLoc,R0);
  resumeNormalLabel = Js::ByteCodeWriter::DefineLabel(this);
  BVar4 = Js::ByteCodeWriter::DefineLabel(this);
  RVar2 = FuncInfo::AcquireTmpRegister(funcInfo);
  if (isAsync) {
    RVar5 = FuncInfo::AcquireTmpRegister(funcInfo);
    uVar3 = FuncInfo::FindOrAddInlineCacheId(funcInfo,resultReg,0x197,false,false);
    Js::ByteCodeWriter::PatchableProperty(this,LdFld,RVar5,resultReg,uVar3,false,false);
    EmitCreateYieldResult(resultReg,RVar5,byteCodeGenerator,funcInfo);
    FuncInfo::ReleaseTmpRegister(funcInfo,RVar5);
    EmitYieldAndResume(RVar2,resultReg,resumeNormalLabel,BVar4,byteCodeGenerator,funcInfo);
    Js::ByteCodeWriter::Reg1(this,LdTrue_ReuseLoc,R0);
    RVar5 = FuncInfo::AcquireTmpRegister(funcInfo);
    BVar6 = Js::ByteCodeWriter::DefineLabel(this);
    EmitGetOptionalObjectMethod(RVar5,iteratorReg,0x135,BVar6,byteCodeGenerator,funcInfo);
    EmitFunctionCall(resultReg,RVar5,iteratorReg,RVar2,byteCodeGenerator,funcInfo);
    FuncInfo::ReleaseTmpRegister(funcInfo,RVar5);
    Js::ByteCodeWriter::Br(this,labelID);
    Js::ByteCodeWriter::MarkLabel(this,BVar6);
    RVar5 = FuncInfo::AcquireTmpRegister(funcInfo);
    Js::ByteCodeWriter::Reg2(this,Ld_A,RVar5,RVar2);
    EmitAwait(RVar5,RVar5,byteCodeGenerator,funcInfo);
    Js::ByteCodeWriter::Reg2(this,Ld_A_ReuseLoc,resultReg,RVar5);
    FuncInfo::ReleaseTmpRegister(funcInfo,RVar5);
  }
  else {
    EmitYieldAndResume(RVar2,resultReg,resumeNormalLabel,BVar4,byteCodeGenerator,funcInfo);
    Js::ByteCodeWriter::Reg1(this,LdTrue_ReuseLoc,R0);
    RVar5 = FuncInfo::AcquireTmpRegister(funcInfo);
    BVar6 = Js::ByteCodeWriter::DefineLabel(this);
    EmitGetOptionalObjectMethod(RVar5,iteratorReg,0x135,BVar6,byteCodeGenerator,funcInfo);
    EmitFunctionCall(resultReg,RVar5,iteratorReg,RVar2,byteCodeGenerator,funcInfo);
    FuncInfo::ReleaseTmpRegister(funcInfo,RVar5);
    Js::ByteCodeWriter::Br(this,labelID);
    Js::ByteCodeWriter::MarkLabel(this,BVar6);
    Js::ByteCodeWriter::Reg2(this,Ld_A_ReuseLoc,resultReg,RVar2);
  }
  Js::ByteCodeWriter::Br(this,labelID_01);
  Js::ByteCodeWriter::MarkLabel(this,BVar4);
  RVar5 = FuncInfo::AcquireTmpRegister(funcInfo);
  BVar4 = Js::ByteCodeWriter::DefineLabel(this);
  EmitGetOptionalObjectMethod(RVar5,iteratorReg,0x16a,BVar4,byteCodeGenerator,funcInfo);
  EmitFunctionCall(resultReg,RVar5,iteratorReg,RVar2,byteCodeGenerator,funcInfo);
  FuncInfo::ReleaseTmpRegister(funcInfo,RVar5);
  Js::ByteCodeWriter::Br(this,labelID);
  Js::ByteCodeWriter::MarkLabel(this,BVar4);
  EmitIteratorClose(iteratorReg,byteCodeGenerator,funcInfo,isAsync);
  Js::ByteCodeWriter::W1(this,RuntimeTypeError,0x1630);
  Js::ByteCodeWriter::MarkLabel(this,resumeNormalLabel);
  EmitFunctionCall(resultReg,value,iteratorReg,RVar2,byteCodeGenerator,funcInfo);
  FuncInfo::ReleaseTmpRegister(funcInfo,RVar2);
  FuncInfo::ReleaseTmpRegister(funcInfo,value);
  FuncInfo::ReleaseTmpRegister(funcInfo,iteratorReg);
  Js::ByteCodeWriter::MarkLabel(this,labelID);
  Js::ByteCodeWriter::Br(this,loopEntrance);
  Js::ByteCodeWriter::MarkLabel(this,labelID_00);
  Js::ByteCodeWriter::ExitLoop(this,uVar1);
  uVar1 = FuncInfo::FindOrAddInlineCacheId(funcInfo,resultReg,0x197,false,false);
  Js::ByteCodeWriter::PatchableProperty(this,LdFld,resultReg,resultReg,uVar1,false,false);
  Js::ByteCodeWriter::BrReg1(this,BrFalse_A,labelID_02,R0);
  FuncInfo::ReleaseTmpRegister(funcInfo,R0);
  Js::ByteCodeWriter::MarkLabel(this,labelID_01);
  EmitReturnFromYield(resultReg,byteCodeGenerator,funcInfo);
  Js::ByteCodeWriter::MarkLabel(this,labelID_02);
  return;
}

Assistant:

void EmitYieldStar(
    ParseNodeUni* yieldStarNode,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    bool isAsync = funcInfo->IsAsyncGenerator();
    auto* writer = byteCodeGenerator->Writer();

    Js::ByteCodeLabel loopEntrance = writer->DefineLabel();
    Js::ByteCodeLabel continueLoop = writer->DefineLabel();
    Js::ByteCodeLabel continuePastLoop = writer->DefineLabel();
    Js::ByteCodeLabel finishReturn = writer->DefineLabel();
    Js::ByteCodeLabel finishNormal = writer->DefineLabel();

    Js::RegSlot yieldStarReg = yieldStarNode->location;

    // Initialize shouldReturn to false; this flag is used to indicate
    // whether we should return or continue after the loop is complete
    Js::RegSlot shouldReturnReg = funcInfo->AcquireTmpRegister();
    writer->Reg1(Js::OpCode::LdFalse, shouldReturnReg);

    // Evaluate operand and get the inner iterator
    Js::RegSlot iteratorReg = funcInfo->AcquireTmpRegister();
    ParseNode* operand = yieldStarNode->pnode1;
    Emit(operand, byteCodeGenerator, funcInfo, false);

    if (isAsync)
        EmitGetAsyncIterator(iteratorReg, operand->location, byteCodeGenerator, funcInfo);
    else
        EmitGetIterator(iteratorReg, operand->location, byteCodeGenerator, funcInfo);

    funcInfo->ReleaseLoc(operand);

    // Load next method
    Js::RegSlot nextMethodReg = funcInfo->AcquireTmpRegister();
    EmitGetObjectMethod(
        nextMethodReg,
        iteratorReg,
        Js::PropertyIds::next,
        byteCodeGenerator,
        funcInfo);

    // Call the next method of iterator to obtain the first result
    EmitFunctionCall(
        yieldStarReg,
        nextMethodReg,
        iteratorReg,
        funcInfo->undefinedConstantRegister,
        byteCodeGenerator,
        funcInfo);

    // Begin loop
    uint loopId = writer->EnterLoop(loopEntrance);

    // If this is an async generator await the yielded value
    if (isAsync)
        EmitAwait(yieldStarReg, yieldStarReg, byteCodeGenerator, funcInfo);

    EmitThrowOnNotObject(yieldStarReg, byteCodeGenerator);

    // Get the iterator result's done property
    Js::RegSlot doneReg = funcInfo->AcquireTmpRegister();
    EmitGetObjectProperty(
        doneReg,
        yieldStarReg,
        Js::PropertyIds::done,
        byteCodeGenerator,
        funcInfo);

    // Break out of loop if the done property is truthy
    writer->BrReg1(Js::OpCode::BrTrue_A, continuePastLoop, doneReg);
    funcInfo->ReleaseTmpRegister(doneReg);

    // Reset shouldReturn to false
    writer->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldReturnReg);

    Js::ByteCodeLabel resumeNormal = writer->DefineLabel();
    Js::ByteCodeLabel resumeThrow = writer->DefineLabel();
    Js::RegSlot resumeValueReg = funcInfo->AcquireTmpRegister();

    if (isAsync)
    {
        // For async generators, extract the value property and wrap it in a
        // new result object, so that exceptions thrown when getting the value
        // property are handled appropriately
        Js::RegSlot valueReg = funcInfo->AcquireTmpRegister();

        EmitGetObjectProperty(
            valueReg,
            yieldStarReg,
            Js::PropertyIds::value,
            byteCodeGenerator,
            funcInfo);

        EmitCreateYieldResult(yieldStarReg, valueReg, byteCodeGenerator, funcInfo);

        funcInfo->ReleaseTmpRegister(valueReg);
    }

    // Yield the next result to the caller
    EmitYieldAndResume(
        resumeValueReg,
        yieldStarReg,
        resumeNormal,
        resumeThrow,
        byteCodeGenerator,
        funcInfo);

    // Return case: set shouldReturn to true and attempt to call return
    writer->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldReturnReg);

    Js::RegSlot returnMethodReg = funcInfo->AcquireTmpRegister();

    // Load return method
    Js::ByteCodeLabel noReturnMethod = writer->DefineLabel();
    EmitGetOptionalObjectMethod(
        returnMethodReg,
        iteratorReg,
        Js::PropertyIds::return_,
        noReturnMethod,
        byteCodeGenerator,
        funcInfo);

    // The iterator has a return method: call method and loop
    EmitFunctionCall(
        yieldStarReg,
        returnMethodReg,
        iteratorReg,
        resumeValueReg,
        byteCodeGenerator,
        funcInfo);

    funcInfo->ReleaseTmpRegister(returnMethodReg);
    writer->Br(continueLoop);

    // The iterator does not have a return method: exit loop
    writer->MarkLabel(noReturnMethod);

    if (isAsync)
    {
        Js::RegSlot awaitValue = funcInfo->AcquireTmpRegister();
        writer->Reg2(Js::OpCode::Ld_A, awaitValue, resumeValueReg);

        EmitAwait(awaitValue, awaitValue, byteCodeGenerator, funcInfo);
        writer->Reg2(Js::OpCode::Ld_A_ReuseLoc, yieldStarReg, awaitValue);

        funcInfo->ReleaseTmpRegister(awaitValue);
    }
    else
        writer->Reg2(Js::OpCode::Ld_A_ReuseLoc, yieldStarReg, resumeValueReg);

    writer->Br(finishReturn);

    // Throw case: attempt to call throw
    writer->MarkLabel(resumeThrow);

    Js::RegSlot throwMethodReg = funcInfo->AcquireTmpRegister();
    Js::ByteCodeLabel noThrowMethod = writer->DefineLabel();

    // Load throw method
    EmitGetOptionalObjectMethod(
        throwMethodReg,
        iteratorReg,
        Js::PropertyIds::throw_,
        noThrowMethod,
        byteCodeGenerator,
        funcInfo);

    // Iterator has throw method: call method and loop
    EmitFunctionCall(
        yieldStarReg,
        throwMethodReg,
        iteratorReg,
        resumeValueReg,
        byteCodeGenerator,
        funcInfo);

    funcInfo->ReleaseTmpRegister(throwMethodReg);
    writer->Br(continueLoop);

    // Iterator does not have a throw method; close the iterator and throw a TypeError
    writer->MarkLabel(noThrowMethod);
    EmitIteratorClose(iteratorReg, byteCodeGenerator, funcInfo, isAsync);
    byteCodeGenerator->Writer()->W1(
        Js::OpCode::RuntimeTypeError,
        SCODE_CODE(JSERR_YieldStarThrowMissing));

    // Normal case: call next method of iterator
    writer->MarkLabel(resumeNormal);
    EmitFunctionCall(
        yieldStarReg,
        nextMethodReg,
        iteratorReg,
        resumeValueReg,
        byteCodeGenerator,
        funcInfo);

    funcInfo->ReleaseTmpRegister(resumeValueReg);
    funcInfo->ReleaseTmpRegister(nextMethodReg);
    funcInfo->ReleaseTmpRegister(iteratorReg);

    // Loop end
    writer->MarkLabel(continueLoop);
    writer->Br(loopEntrance);
    writer->MarkLabel(continuePastLoop);
    writer->ExitLoop(loopId);

    // Load the iterator result value into place
    EmitGetObjectProperty(
        yieldStarReg,
        yieldStarReg,
        Js::PropertyIds::value,
        byteCodeGenerator,
        funcInfo);
    
    writer->BrReg1(Js::OpCode::BrFalse_A, finishNormal, shouldReturnReg);
    funcInfo->ReleaseTmpRegister(shouldReturnReg);

    // Return case: return the value from the generator
    writer->MarkLabel(finishReturn);
    EmitReturnFromYield(yieldStarReg, byteCodeGenerator, funcInfo);

    // Normal case
    writer->MarkLabel(finishNormal);
}